

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::verifySampleBuffers
          (SampleMaskUniqueSetCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  const_reference pvVar1;
  reference this_00;
  int local_1c;
  int ndx;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers_local;
  SampleMaskUniqueSetCase *this_local;
  
  for (local_1c = 0;
      local_1c <
      (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numTargetSamples; local_1c = local_1c + 1) {
    pvVar1 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       (resultBuffers,(long)local_1c);
    this_00 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                        (&this->m_iterationSampleBuffers,
                         (long)((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.m_iteration *
                                (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.m_numTargetSamples + local_1c));
    tcu::Surface::operator=(this_00,pvVar1);
  }
  return true;
}

Assistant:

bool SampleMaskUniqueSetCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	// we need results from all passes to do verification. Store results and verify later (at postTest).

	DE_ASSERT(m_numTargetSamples == (int)resultBuffers.size());
	for (int ndx = 0; ndx < m_numTargetSamples; ++ndx)
		m_iterationSampleBuffers[m_iteration * m_numTargetSamples + ndx] = resultBuffers[ndx];

	return true;
}